

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

void deqp::gles31::Functional::checkTextureTypeExtensions
               (ContextInfo *contextInfo,TextureType type,RenderContext *renderContext)

{
  bool bVar1;
  NotSupportedError *this;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  deUint32 local_28;
  ContextType local_24;
  RenderContext *local_20;
  RenderContext *renderContext_local;
  ContextInfo *pCStack_10;
  TextureType type_local;
  ContextInfo *contextInfo_local;
  
  if (type == TEXTURETYPE_BUFFER) {
    local_20 = renderContext;
    renderContext_local._4_4_ = type;
    pCStack_10 = contextInfo;
    bVar1 = glu::ContextInfo::isExtensionSupported(contextInfo,"GL_EXT_texture_buffer");
    if (!bVar1) {
      local_24.super_ApiType.m_bits = (ApiType)(*local_20->_vptr_RenderContext[2])();
      local_28 = (deUint32)glu::ApiType::es(3,2);
      bVar1 = glu::contextSupports(local_24,(ApiType)local_28);
      if (!bVar1) {
        this = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"GL_EXT_texture_buffer",&local_89);
        std::operator+(&local_68,"Test requires ",&local_88);
        std::operator+(&local_48,&local_68," extension");
        tcu::NotSupportedError::NotSupportedError(this,&local_48);
        __cxa_throw(this,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
    }
  }
  return;
}

Assistant:

static inline void checkTextureTypeExtensions (const glu::ContextInfo& contextInfo, TextureType type, const RenderContext& renderContext)
{
	if (type == TEXTURETYPE_BUFFER && !contextInfo.isExtensionSupported(s_texBufExtString) && !glu::contextSupports(renderContext.getType(), glu::ApiType::es(3, 2)))
		throw tcu::NotSupportedError("Test requires " + string(s_texBufExtString) + " extension");
}